

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<ParsedGame> *
Parser::parse_from_string
          (optional<ParsedGame> *__return_storage_ptr__,string *p_text,
          shared_ptr<PSLogger> *p_logger)

{
  tuple<TextProvider_*,_std::default_delete<TextProvider>_> this;
  pointer *__ptr;
  __uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_> local_68;
  __shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  this.super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
  super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>)operator_new(0x58);
  std::__shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,&p_logger->super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&local_40,(string *)p_text);
  TextProviderString::TextProviderString
            ((TextProviderString *)
             this.super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
             super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl,
             (shared_ptr<PSLogger> *)&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  local_68._M_t.super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
  super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl =
       (tuple<TextProvider_*,_std::default_delete<TextProvider>_>)
       (tuple<TextProvider_*,_std::default_delete<TextProvider>_>)
       this.super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
       super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl;
  std::__shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&p_logger->super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>);
  parse_from_text_provider
            (__return_storage_ptr__,
             (unique_ptr<TextProvider,_std::default_delete<TextProvider>_> *)&local_68,
             (shared_ptr<PSLogger> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  if (local_68._M_t.super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
      super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>)0x0) {
    (**(code **)(*(long *)local_68._M_t.
                          super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                          .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<ParsedGame> Parser::parse_from_string(string p_text, shared_ptr<PSLogger> p_logger)
{
	unique_ptr<TextProvider> txt_provider(new TextProviderString(p_logger,p_text));
	return parse_from_text_provider(move(txt_provider),p_logger);
}